

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valfmt_get.c
# Opt level: O2

int mpt_valfmt_get(mpt_value_format *ptr,char *src)

{
  char cVar1;
  ushort *puVar2;
  __int32_t **pp_Var3;
  ulong uVar4;
  ulong uVar5;
  int *piVar6;
  int iVar7;
  char *pcVar8;
  char *__nptr;
  long lVar9;
  ushort uVar10;
  uint16_t uVar11;
  ushort uVar12;
  uint8_t local_4c;
  char *next;
  ushort **local_38;
  
  if (src == (char *)0x0) {
    ptr->flags = 0;
    ptr->width = '\0';
    ptr->dec = '\0';
    return 0;
  }
  local_38 = __ctype_b_loc();
  puVar2 = *local_38;
  iVar7 = -1;
  pcVar8 = src;
  do {
    __nptr = pcVar8;
    cVar1 = *__nptr;
    lVar9 = (long)cVar1;
    pcVar8 = __nptr + 1;
    iVar7 = iVar7 + 1;
  } while ((*(byte *)((long)puVar2 + lVar9 * 2 + 1) & 0x20) != 0);
  if (cVar1 == '\0') {
    ptr->flags = 0;
    ptr->width = '\0';
    ptr->dec = '\0';
    return iVar7;
  }
  if (cVar1 == '+') {
    lVar9 = (long)*pcVar8;
    uVar12 = 0x100;
    uVar10 = 0x100;
    uVar11 = 0x100;
    __nptr = pcVar8;
  }
  else {
    uVar12 = 0;
    uVar10 = 0;
    uVar11 = 0;
  }
  pp_Var3 = __ctype_tolower_loc();
  iVar7 = (*pp_Var3)[lVar9];
  switch(iVar7) {
  case 0x61:
    uVar11 = uVar10 | 0x20;
    break;
  case 0x62:
  case 99:
  case 100:
switchD_001118fd_caseD_62:
    if ((*(byte *)((long)puVar2 + lVar9 * 2 + 1) & 8) == 0) {
      return -1;
    }
    goto LAB_00111954;
  case 0x65:
switchD_001118fd_caseD_65:
    uVar11 = uVar12 | 0x20;
    goto LAB_00111951;
  case 0x66:
    local_4c = '\x06';
    goto LAB_0011193c;
  case 0x67:
    local_4c = '\0';
LAB_0011193c:
    __nptr = __nptr + 1;
    goto LAB_0011195c;
  default:
    if (iVar7 == 0x6f) {
      uVar12 = uVar11 | 2;
      goto switchD_001118fd_caseD_65;
    }
    if (iVar7 != 0x78) goto switchD_001118fd_caseD_62;
  }
  uVar11 = uVar11 | 0x11;
LAB_00111951:
  __nptr = __nptr + 1;
LAB_00111954:
  local_4c = '\0';
LAB_0011195c:
  uVar4 = strtol(__nptr,&next,0);
  iVar7 = -1;
  if ((next != __nptr) && (iVar7 = -2, uVar4 < 0x100)) {
    cVar1 = *next;
    if (((long)cVar1 == 0) || ((*(byte *)((long)*local_38 + (long)cVar1 * 2 + 1) & 0x20) != 0)) {
      ptr->flags = uVar11;
      ptr->width = (uint8_t)uVar4;
      ptr->dec = local_4c;
      iVar7 = (int)next - (int)src;
    }
    else if (cVar1 == '.') {
      pcVar8 = next + 1;
      uVar5 = strtol(pcVar8,&next,0);
      iVar7 = -1;
      if ((next != pcVar8) && (iVar7 = -2, uVar5 < 0x7f)) {
        ptr->flags = uVar11;
        ptr->width = (uint8_t)uVar4;
        ptr->dec = (uint8_t)uVar5;
        iVar7 = (int)next - (int)src;
      }
    }
    else {
      piVar6 = __errno_location();
      *piVar6 = 0x16;
      iVar7 = -3;
    }
  }
  return iVar7;
}

Assistant:

extern int mpt_valfmt_get(MPT_STRUCT(value_format) *ptr, const char *src)
{
	MPT_STRUCT(value_format) fmt = MPT_VALFMT_INIT;
	const char *pos;
	char *next;
	long val;
	
	if (!(pos = src)) {
		*ptr = fmt;
		return 0;
	}
	while (isspace(*pos)) {
		pos++;
	}
	/* select format */
	if (!*pos) {
		*ptr = fmt;
		return pos - src;
	}
	if (*pos == '+') {
		fmt.flags |= MPT_VALFMT(Sign);
		++pos;
	}
	
	switch (tolower(*pos)) {
	  case 'f': fmt.dec = 6; /* fall through */
	  case 'g': ++pos; break;
	  case 'a': fmt.flags |= MPT_VALFMT(Scientific); /* fall through */
	  case 'x': fmt.flags |= MPT_VALFMT(NumberHex); ++pos; break;
	  case 'o': fmt.flags |= MPT_VALFMT(IntOctal); /* fall through */
	  case 'e': fmt.flags |= MPT_VALFMT(Scientific); ++pos; break;
	  default:
		if (!isdigit(*pos)) {
			return MPT_ERROR(BadArgument);
		}
	}
	/* get field with */
	val = strtol(pos, &next, 0);
	
	if (next == pos) {
		return MPT_ERROR(BadArgument);
	}
	pos = next;
	if (val < 0 || val > UINT8_MAX) {
		return MPT_ERROR(BadValue);
	}
	fmt.width = val;
	if (!*pos || isspace(*pos)) {
		*ptr = fmt;
		return pos - src;
	}
	if (*(pos++) != '.') {
		errno = EINVAL;
		return -3;
	}
	/* get digits after decimal point */
	val = strtol(pos, &next, 0);
	
	if (next == pos) {
		return MPT_ERROR(BadArgument);
	}
	pos = next;
	if (val < 0 || val >= INT8_MAX) {
		return MPT_ERROR(BadValue);
	}
	fmt.dec = val;
	
	*ptr = fmt;
	
	return pos - src;
}